

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_com.c
# Opt level: O1

RK_S32 hal_h265d_slice_output_rps(void *dxva,void *rps_buf)

{
  ushort uVar1;
  ushort uVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  RK_S32 num_bits;
  SliceType_conflict SVar6;
  RK_S32 RVar7;
  RK_U32 RVar8;
  void *pvVar9;
  long lVar10;
  RK_U64 *data;
  byte bVar11;
  uint uVar12;
  SliceType_conflict SVar13;
  char *fmt;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  RefPicList_t *pRVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  undefined1 *puVar21;
  undefined1 *puVar22;
  MPP_RET MVar23;
  MPP_RET MVar24;
  bool bVar25;
  BitReadCtx_t gb_cxt;
  RefPicListTab_t ref;
  SliceHeader_t sh;
  RK_U8 lowdelay_flag [600];
  RK_U8 slice_nb_rps_poc [600];
  RK_U8 rps_bit_offset [600];
  RK_U8 rps_bit_offset_st [600];
  slice_ref_map_t rps_pic_info [600] [2] [15];
  ulong local_9a58;
  SliceType_conflict local_9a4c;
  SliceType_conflict local_9a3c;
  ulong local_9a28;
  BitReadCtx_t local_9a10;
  long local_99b8;
  void *local_99b0;
  RefPicList_t local_99a8 [2];
  SliceHeader_t local_9920;
  byte local_9658 [608];
  byte local_93f8 [608];
  byte local_9198 [608];
  byte local_8f38 [608];
  undefined1 local_8cd8;
  undefined1 local_8cd7 [36007];
  
  local_99b0 = rps_buf;
  memset(&local_8cd8,0,36000);
  memset(local_93f8,0,600);
  memset(local_9198,0,600);
  memset(local_8f38,0,600);
  pvVar9 = memset(local_9658,0,600);
  if (*(int *)((long)dxva + 0x1e54) == 0) {
    uVar14 = 1;
  }
  else {
    uVar14 = 0;
    local_9a28 = (ulong)pvVar9 & 0xffffffff;
    iVar5 = 0;
    SVar6 = B_SLICE;
    do {
      memset(&local_9920,0,0x2c8);
      mpp_set_bitread_ctx(&local_9a10,
                          (RK_U8 *)((ulong)*(uint *)(*(long *)((long)dxva + 0x1e58) + uVar14 * 0xc)
                                   + *(long *)((long)dxva + 0x1e60)),
                          *(RK_S32 *)(*(long *)((long)dxva + 0x1e58) + 4 + uVar14 * 0xc));
      mpp_set_bitread_pseudo_code_type(&local_9a10,PSEUDO_CODE_H264_H265);
      local_9a10.ret = mpp_read_bits(&local_9a10,1,(RK_S32 *)local_99a8);
      MVar24 = ~MPP_ERR_TIMEOUT;
      if ((local_9a10.ret == MPP_OK) &&
         (MVar23 = ~MPP_ERR_UNKNOW, MVar24 = MVar23, local_99a8[0].dpb_index[0] == B_SLICE)) {
        local_9a10.ret = mpp_read_bits(&local_9a10,6,(RK_S32 *)local_99a8);
        RVar8 = local_99a8[0].dpb_index[0];
        MVar24 = ~MPP_ERR_TIMEOUT;
        if (local_9a10.ret == MPP_OK) {
          if (local_99a8[0].dpb_index[0] < 0x18) {
            local_9a10.ret = mpp_skip_longbits(&local_9a10,9);
            if (local_9a10.ret == MPP_OK) {
              local_9a10.ret = mpp_read_bits(&local_9a10,1,(RK_S32 *)local_99a8);
              MVar24 = ~MPP_ERR_TIMEOUT;
              if (local_9a10.ret == MPP_OK) {
                local_9920.first_slice_in_pic_flag = (RK_U8)local_99a8[0].dpb_index[0];
                if (0xf < RVar8) {
                  local_9a10.ret = mpp_read_bits(&local_9a10,1,(RK_S32 *)local_99a8);
                  MVar24 = ~MPP_ERR_TIMEOUT;
                  if (local_9a10.ret != MPP_OK) goto LAB_001fcf5e;
                  local_9920.no_output_of_prior_pics_flag = (RK_U8)local_99a8[0].dpb_index[0];
                }
                local_9a10.ret = MPP_OK;
                local_9a10.ret = mpp_read_ue(&local_9a10,local_99a8[0].dpb_index);
                MVar24 = ~MPP_ERR_TIMEOUT;
                if (local_9a10.ret == MPP_OK) {
                  local_9920.pps_id = local_99a8[0].dpb_index[0];
                  if (local_99a8[0].dpb_index[0] < 0x40) {
                    local_9920.dependent_slice_segment_flag = '\0';
                    if (local_9920.first_slice_in_pic_flag == '\0') {
                      bVar11 = *(char *)((long)dxva + 8) + 3;
                      uVar1 = *dxva;
                      bVar4 = *(char *)((long)dxva + 8) + *(char *)((long)dxva + 9) + 3;
                      uVar2 = *(ushort *)((long)dxva + 2);
                      iVar18 = 1 << (bVar4 & 0x1f);
                      if ((*(byte *)((long)dxva + 0x1a) & 0x10) == 0) {
LAB_001fd1ff:
                        local_9a10.ret = MPP_OK;
                        SVar13 = ((int)(((uint)uVar1 << (bVar11 & 0x1f)) + iVar18 + -1) >>
                                 (bVar4 & 0x1f)) *
                                 ((int)(((uint)uVar2 << (bVar11 & 0x1f)) + iVar18 + -1) >>
                                 (bVar4 & 0x1f));
                        RVar7 = mpp_log2(SVar13 * 2 - 2);
                        local_9a10.ret = mpp_read_bits(&local_9a10,RVar7,(RK_S32 *)local_99a8);
                        MVar24 = ~MPP_ERR_TIMEOUT;
                        if (local_9a10.ret == MPP_OK) {
                          local_9920.slice_segment_addr = local_99a8[0].dpb_index[0];
                          if (local_99a8[0].dpb_index[0] < SVar13) {
                            MVar24 = MPP_OK;
                            if (local_9920.dependent_slice_segment_flag == '\0') {
                              local_9920.slice_addr = local_99a8[0].dpb_index[0];
                              iVar5 = iVar5 + 1;
                            }
                          }
                          else {
                            _mpp_log_l(2,"hal_h265d_com","Invalid slice segment address: %u.\n",
                                       (char *)0x0);
                            MVar24 = ~MPP_ERR_UNKNOW;
                          }
                        }
                      }
                      else {
                        local_9a10.ret = mpp_read_bits(&local_9a10,1,(RK_S32 *)local_99a8);
                        MVar24 = ~MPP_ERR_TIMEOUT;
                        if (local_9a10.ret == MPP_OK) {
                          local_9920.dependent_slice_segment_flag =
                               (RK_U8)local_99a8[0].dpb_index[0];
                          goto LAB_001fd1ff;
                        }
                      }
                      if (MVar24 != MPP_OK) goto LAB_001fcf5e;
                    }
                    else {
                      local_9920.slice_segment_addr = 0;
                      local_9920.slice_addr = 0;
                      iVar5 = 0;
                    }
                    if (local_9920.dependent_slice_segment_flag == '\0') {
                      if ((*(ushort *)((long)dxva + 0x1a) & 0x1c0) != 0) {
                        uVar12 = 0;
                        MVar24 = local_9a10.ret;
                        do {
                          local_9a10.ret = MVar24;
                          local_9a10.ret = mpp_skip_longbits(&local_9a10,1);
                          if (local_9a10.ret != MPP_OK) goto LAB_001fcf58;
                          uVar12 = uVar12 + 1;
                          local_9a10.ret = MPP_OK;
                          MVar24 = MPP_OK;
                        } while (uVar12 < (*(uint *)((long)dxva + 0x18) >> 0x16 & 7));
                      }
                      local_9a10.ret = mpp_read_ue(&local_9a10,local_99a8[0].dpb_index);
                      MVar24 = ~MPP_ERR_TIMEOUT;
                      if (local_9a10.ret != MPP_OK) goto LAB_001fcf5e;
                      local_9920.slice_type = local_99a8[0].dpb_index[0];
                      if (I_SLICE < local_99a8[0].dpb_index[0]) {
                        fmt = "Unknown slice type: %d.\n";
                        goto LAB_001fd050;
                      }
                      if ((*(byte *)((long)dxva + 0x1a) & 0x20) != 0) {
                        local_9a10.ret = mpp_read_bits(&local_9a10,1,(RK_S32 *)local_99a8);
                        MVar24 = ~MPP_ERR_TIMEOUT;
                        if (local_9a10.ret != MPP_OK) goto LAB_001fcf5e;
                        local_9920.pic_output_flag = (RK_U8)local_99a8[0].dpb_index[0];
                      }
                      if ((*(byte *)((long)dxva + 4) & 4) != 0) {
                        local_9a10.ret = mpp_read_bits(&local_9a10,2,(RK_S32 *)local_99a8);
                        MVar24 = ~MPP_ERR_TIMEOUT;
                        if (local_9a10.ret != MPP_OK) goto LAB_001fcf5e;
                        local_9920.colour_plane_id = (RK_U8)local_99a8[0].dpb_index[0];
                      }
                      if (RVar8 - 0x13 < 2) {
                        local_9920.short_term_rps = (ShortTermRPS_conflict *)0x0;
                      }
                      else {
                        local_9a10.ret =
                             mpp_read_bits(&local_9a10,(*(uint *)((long)dxva + 4) >> 9 & 0xf) + 4,
                                           (RK_S32 *)local_99a8);
                        local_9a58._0_4_ = ~MPP_ERR_TIMEOUT;
                        if (local_9a10.ret == MPP_OK) {
                          local_9920.pic_order_cnt_lsb = local_99a8[0].dpb_index[0];
                          local_9a10.ret = mpp_read_bits(&local_9a10,1,(RK_S32 *)local_99a8);
                          RVar7 = local_9a10.used_bits;
                          local_9a58._0_4_ = ~MPP_ERR_TIMEOUT;
                          if (local_9a10.ret == MPP_OK) {
                            if (local_99a8[0].dpb_index[0] == B_SLICE) {
                              local_9a10.ret =
                                   mpp_skip_longbits(&local_9a10,
                                                     (uint)*(ushort *)((long)dxva + 0x14));
                              if (local_9a10.ret == MPP_OK) goto LAB_001fd91a;
                              local_9a58._0_4_ = ~MPP_ERR_TIMEOUT;
                            }
                            else {
                              if (*(byte *)((long)dxva + 0xe) == 0) {
                                _mpp_log_l(2,"hal_h265d_com","No ref lists in the SPS.\n",
                                           (char *)0x0);
                                local_9a58._0_4_ = ~MPP_ERR_UNKNOW;
                              }
                              else {
                                num_bits = mpp_log2((uint)*(byte *)((long)dxva + 0xe) * 2 - 2);
                                if (0 < num_bits) {
                                  local_9a10.ret =
                                       mpp_read_bits(&local_9a10,num_bits,(RK_S32 *)local_99a8);
                                  local_9a58._0_4_ = ~MPP_ERR_TIMEOUT;
                                  if (local_9a10.ret != MPP_OK) goto LAB_001fd910;
                                }
                                local_9a58._0_4_ = MPP_OK;
                              }
LAB_001fd910:
                              if ((MPP_RET)local_9a58 == MPP_OK) {
LAB_001fd91a:
                                cVar3 = (char)local_9a10.used_bits;
                                bVar4 = cVar3 - (char)RVar7;
                                local_99b8 = (long)iVar5;
                                local_8f38[local_99b8] = bVar4;
                                local_9198[local_99b8] = bVar4;
                                if ((*(byte *)((long)dxva + 0x1a) & 2) != 0) {
                                  if (*(char *)((long)dxva + 0xf) == '\0') {
                                    local_9a3c = B_SLICE;
LAB_001fda07:
                                    local_9a10.ret =
                                         mpp_read_ue(&local_9a10,local_99a8[0].dpb_index);
                                    local_9a58._0_4_ = ~MPP_ERR_TIMEOUT;
                                    if (local_9a10.ret == MPP_OK) {
                                      SVar6 = local_99a8[0].dpb_index[0] + local_9a3c;
                                      if (SVar6 != B_SLICE) {
                                        local_9a4c = B_SLICE;
                                        do {
                                          if (local_9a4c < local_9a3c) {
                                            if (1 < *(byte *)((long)dxva + 0xf)) {
                                              RVar7 = mpp_log2((uint)*(byte *)((long)dxva + 0xf) * 2
                                                               - 2);
                                              local_9a10.ret =
                                                   mpp_read_bits(&local_9a10,RVar7,
                                                                 (RK_S32 *)local_99a8);
                                              local_9a58._0_4_ = ~MPP_ERR_TIMEOUT;
                                              MVar24 = (MPP_RET)local_9a58;
                                              if (local_9a10.ret != MPP_OK) goto joined_r0x001fdaec;
                                            }
                                            local_9a58._0_4_ = MPP_OK;
                                            MVar24 = (MPP_RET)local_9a58;
joined_r0x001fdaec:
                                            if (MVar24 == MPP_OK) {
                                              local_9a10.ret =
                                                   mpp_read_bits(&local_9a10,1,(RK_S32 *)local_99a8)
                                              ;
                                              bVar25 = local_9a10.ret != MPP_OK;
                                              local_9a58._0_4_ = local_9a10.ret;
                                              if (bVar25) {
                                                local_9a58._0_4_ = ~MPP_ERR_TIMEOUT;
                                              }
                                              SVar13 = (SliceType_conflict)local_9a28 & 0xff;
                                              if (!bVar25) {
                                                SVar13 = local_99a8[0].dpb_index[0];
                                              }
                                              local_9a28 = (ulong)SVar13;
                                              if (!bVar25) {
                                                local_9a28._0_1_ = (char)SVar13;
                                                if ((char)local_9a28 != '\0') {
                                                  local_9a10.ret =
                                                       mpp_read_ue(&local_9a10,
                                                                   local_99a8[0].dpb_index);
                                                  local_9a58._0_4_ = ~MPP_ERR_TIMEOUT;
                                                  if (local_9a10.ret != MPP_OK) goto LAB_001fdb5a;
                                                }
                                                local_9a58._0_4_ = MPP_OK;
                                              }
                                            }
                                          }
                                          else {
                                            local_9a10.ret =
                                                 mpp_skip_longbits(&local_9a10,
                                                                   (*(uint *)((long)dxva + 4) >> 9 &
                                                                   0xf) + 4);
                                            local_9a58._0_4_ = ~MPP_ERR_TIMEOUT;
                                            if (local_9a10.ret == MPP_OK) {
                                              local_9a10.ret = mpp_skip_longbits(&local_9a10,1);
                                              MVar24 = local_9a10.ret;
                                              goto joined_r0x001fdaec;
                                            }
                                          }
LAB_001fdb5a:
                                          if ((MPP_RET)local_9a58 != MPP_OK) goto LAB_001fdb96;
                                          local_9a4c = local_9a4c + P_SLICE;
                                        } while (SVar6 != local_9a4c);
                                      }
                                      local_9198[local_99b8] =
                                           ((char)local_9a10.used_bits - cVar3) + bVar4;
                                      local_9a58._0_4_ = MPP_OK;
                                    }
                                  }
                                  else {
                                    local_9a10.ret =
                                         mpp_read_ue(&local_9a10,local_99a8[0].dpb_index);
                                    local_9a58._0_4_ = ~MPP_ERR_TIMEOUT;
                                    if (local_9a10.ret == MPP_OK) {
                                      local_9a3c = local_99a8[0].dpb_index[0];
                                      local_9a10.ret = MPP_OK;
                                      goto LAB_001fda07;
                                    }
                                  }
LAB_001fdb96:
                                  if ((MPP_RET)local_9a58 != MPP_OK) goto LAB_001fd47c;
                                }
                                if ((*(byte *)((long)dxva + 0x1a) & 4) == 0) {
                                  local_9920.slice_temporal_mvp_enabled_flag = '\0';
                                }
                                else {
                                  local_9a10.ret = mpp_read_bits(&local_9a10,1,(RK_S32 *)local_99a8)
                                  ;
                                  local_9a58._0_4_ = ~MPP_ERR_TIMEOUT;
                                  if (local_9a10.ret != MPP_OK) goto LAB_001fd47c;
                                  local_9920.slice_temporal_mvp_enabled_flag =
                                       (RK_U8)local_99a8[0].dpb_index[0];
                                }
                                local_9a58._0_4_ = MPP_OK;
                              }
                            }
                          }
                        }
LAB_001fd47c:
                        MVar24 = (MPP_RET)local_9a58;
                        if ((MPP_RET)local_9a58 != MPP_OK) goto LAB_001fcf5e;
                      }
                      if ((*(byte *)((long)dxva + 0x18) & 4) == 0) {
                        local_9920.slice_sample_adaptive_offset_flag[0] = '\0';
                        local_9920.slice_sample_adaptive_offset_flag[1] = '\0';
                        local_9920.slice_sample_adaptive_offset_flag[2] = '\0';
LAB_001fd4a8:
                        SVar13 = local_9920.slice_type;
                        local_9920.nb_refs[0] = 0;
                        local_9920.nb_refs[1] = 0;
                        if (P_SLICE < local_9920.slice_type) goto LAB_001fd099;
                        local_9920.nb_refs[0] = *(byte *)((long)dxva + 0x10) + 1;
                        local_9920.nb_refs[1] = 0;
                        if (local_9920.slice_type == B_SLICE) {
                          local_9920.nb_refs[1] = *(byte *)((long)dxva + 0x11) + 1;
                        }
                        local_9a10.ret = mpp_read_bits(&local_9a10,1,(RK_S32 *)local_99a8);
                        MVar24 = ~MPP_ERR_TIMEOUT;
                        if (local_9a10.ret == MPP_OK) {
                          if (local_99a8[0].dpb_index[0] != B_SLICE) {
                            local_9a10.ret = mpp_read_ue(&local_9a10,local_99a8[0].dpb_index);
                            MVar24 = ~MPP_ERR_TIMEOUT;
                            if (local_9a10.ret != MPP_OK) goto LAB_001fcf5e;
                            local_9920.nb_refs[0] = local_99a8[0].dpb_index[0] + P_SLICE;
                            if (SVar13 == B_SLICE) {
                              local_9a10.ret = mpp_read_ue(&local_9a10,local_99a8[0].dpb_index);
                              MVar24 = ~MPP_ERR_TIMEOUT;
                              if (local_9a10.ret != MPP_OK) goto LAB_001fcf5e;
                              local_9920.nb_refs[1] = local_99a8[0].dpb_index[0] + P_SLICE;
                            }
                          }
                          if (local_9920.nb_refs[1] < 0x11 && local_9920.nb_refs[0] < 0x11) {
                            local_9920.rpl_modification_flag[0] = '\0';
                            local_9920.rpl_modification_flag[1] = '\0';
                            lVar10 = 0;
                            SVar6 = B_SLICE;
                            do {
                              if (*(char *)((long)dxva + lVar10 + 0x7c) != -1) {
                                if (((byte)hal_h265d_debug & 2) != 0) {
                                  _mpp_log_l(4,"hal_h265d_com",
                                             "dxva_cxt->pp.RefPicList[i].bPicEntry = %d",(char *)0x0
                                            );
                                }
                                SVar6 = SVar6 + P_SLICE;
                              }
                              lVar10 = lVar10 + 1;
                            } while (lVar10 != 0xf);
                            if (SVar6 != B_SLICE) {
                              if ((SVar6 != P_SLICE & *(byte *)((long)dxva + 0x1d) >> 6) == 1) {
                                local_9a10.ret = mpp_read_bits(&local_9a10,1,(RK_S32 *)local_99a8);
                                MVar24 = ~MPP_ERR_TIMEOUT;
                                if (local_9a10.ret != MPP_OK) goto LAB_001fcf5e;
                                local_9920.rpl_modification_flag[0] =
                                     (RK_U8)local_99a8[0].dpb_index[0];
                                if (((RK_U8)local_99a8[0].dpb_index[0] != '\0') &&
                                   (local_9920.nb_refs[0] != 0)) {
                                  local_9a58 = 0;
                                  do {
                                    local_9a10.ret = MPP_OK;
                                    RVar7 = mpp_log2(SVar6 * 2 - 2);
                                    local_9a10.ret =
                                         mpp_read_bits(&local_9a10,RVar7,(RK_S32 *)local_99a8);
                                    MVar24 = ~MPP_ERR_TIMEOUT;
                                    if (local_9a10.ret != MPP_OK) goto LAB_001fcf5e;
                                    local_9920.list_entry_lx[0][local_9a58] =
                                         local_99a8[0].dpb_index[0];
                                    local_9a58 = local_9a58 + 1;
                                  } while (local_9a58 < ((ulong)local_9920.nb_refs & 0xffffffff));
                                }
                                if (SVar13 == B_SLICE) {
                                  local_9a10.ret = mpp_read_bits(&local_9a10,1,(RK_S32 *)local_99a8)
                                  ;
                                  MVar24 = ~MPP_ERR_TIMEOUT;
                                  if (local_9a10.ret != MPP_OK) goto LAB_001fcf5e;
                                  local_9920.rpl_modification_flag[1] =
                                       (RK_U8)local_99a8[0].dpb_index[0];
                                  if (((RK_U8)local_99a8[0].dpb_index[0] == '\x01') &&
                                     (local_9920.nb_refs[1] != 0)) {
                                    local_9a58 = 0;
                                    do {
                                      local_9a10.ret = MPP_OK;
                                      RVar7 = mpp_log2(SVar6 * 2 - 2);
                                      local_9a10.ret =
                                           mpp_read_bits(&local_9a10,RVar7,(RK_S32 *)local_99a8);
                                      MVar24 = ~MPP_ERR_TIMEOUT;
                                      if (local_9a10.ret != MPP_OK) goto LAB_001fcf5e;
                                      local_9920.list_entry_lx[1][local_9a58] =
                                           local_99a8[0].dpb_index[0];
                                      local_9a58 = local_9a58 + 1;
                                    } while (local_9a58 < (ulong)local_9920.nb_refs >> 0x20);
                                  }
                                }
                              }
                              goto LAB_001fd099;
                            }
                            SVar6 = B_SLICE;
                            _mpp_log_l(2,"hal_h265d_com",
                                       "Zero refs for a frame with P or B slices.\n",(char *)0x0);
                            MVar24 = MVar23;
                          }
                          else {
                            _mpp_log_l(2,"hal_h265d_com","Too many refs: %d/%d.\n",(char *)0x0);
                            MVar24 = MVar23;
                          }
                        }
                      }
                      else {
                        local_9a10.ret = mpp_read_bits(&local_9a10,1,(RK_S32 *)local_99a8);
                        MVar24 = ~MPP_ERR_TIMEOUT;
                        if (local_9a10.ret == MPP_OK) {
                          local_9920.slice_sample_adaptive_offset_flag[0] =
                               (RK_U8)local_99a8[0].dpb_index[0];
                          local_9a10.ret = mpp_read_bits(&local_9a10,1,(RK_S32 *)local_99a8);
                          MVar24 = ~MPP_ERR_TIMEOUT;
                          if (local_9a10.ret == MPP_OK) {
                            local_9920.slice_sample_adaptive_offset_flag[1] =
                                 (RK_U8)local_99a8[0].dpb_index[0];
                            local_9920.slice_sample_adaptive_offset_flag[2] =
                                 (RK_U8)local_99a8[0].dpb_index[0];
                            goto LAB_001fd4a8;
                          }
                        }
                      }
                    }
                    else {
LAB_001fd099:
                      SVar13 = local_9920.slice_type;
                      if (local_9920.slice_type != I_SLICE &&
                          local_9920.dependent_slice_segment_flag == '\0') {
                        hal_h265d_slice_rpl(dxva,&local_9920,(RefPicListTab_t *)local_99a8);
                        lVar10 = (long)iVar5;
                        local_9658[lVar10] = 1;
                        puVar22 = local_8cd7 + lVar10 * 0x3c;
                        uVar16 = 0;
                        pRVar17 = local_99a8;
                        do {
                          uVar12 = local_99a8[uVar16].nb_refs;
                          if ((ulong)uVar12 != 0) {
                            uVar19 = 0;
                            do {
                              bVar4 = (byte)((RefPicList_t *)pRVar17->dpb_index)->dpb_index[uVar19];
                              uVar20 = (ulong)bVar4;
                              if (uVar20 != 0xff) {
                                puVar22[uVar19 * 2 + -1] = bVar4;
                                puVar22[uVar19 * 2] = *(byte *)((long)dxva + uVar20 + 0x7c) >> 7;
                                if (*(int *)((long)dxva + 0x78) <
                                    *(int *)((long)dxva + uVar20 * 4 + 0x8c)) {
                                  local_9658[lVar10] = 0;
                                }
                              }
                              uVar19 = uVar19 + 1;
                            } while (uVar12 != uVar19);
                          }
                          uVar16 = uVar16 + 1;
                          pRVar17 = pRVar17 + 1;
                          puVar22 = puVar22 + 0x1e;
                        } while (uVar16 != 2 - SVar13);
                        if (SVar13 == I_SLICE) {
                          local_93f8[lVar10] = 0;
                        }
                        else {
                          local_93f8[lVar10] = (byte)SVar6;
                        }
                      }
                      MVar24 = MPP_OK;
                    }
                  }
                  else {
                    fmt = "PPS id out of range: %d\n";
LAB_001fd050:
                    _mpp_log_l(2,"hal_h265d_com",fmt,(char *)0x0);
                    MVar24 = MVar23;
                  }
                }
              }
            }
            else {
LAB_001fcf58:
              MVar24 = ~MPP_ERR_TIMEOUT;
            }
          }
          else {
            MVar24 = MPP_OK;
          }
        }
      }
LAB_001fcf5e:
      if ((MVar24 & MPP_ERR_OPEN_FILE) != MPP_OK) {
        return -0x3ec;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < *(uint *)((long)dxva + 0x1e54));
    uVar14 = (ulong)(iVar5 + 1);
  }
  iVar5 = (int)uVar14;
  RVar8 = iVar5 * 4 + 1;
  data = (RK_U64 *)mpp_osal_malloc("hal_h265d_slice_output_rps",(long)(int)RVar8 * 8);
  mpp_set_bitput_ctx((BitputCtx_t *)local_99a8,data,RVar8);
  if (iVar5 != 0) {
    puVar22 = local_8cd7;
    uVar16 = 0;
    do {
      puVar21 = puVar22;
      lVar10 = 0;
      do {
        lVar15 = 0;
        do {
          mpp_put_bits((BitputCtx_t *)local_99a8,(ulong)(byte)puVar21[lVar15 * 2],1);
          if (lVar15 == 4 && lVar10 == 1) {
            mpp_put_align((BitputCtx_t *)local_99a8,0x40,0);
          }
          mpp_put_bits((BitputCtx_t *)local_99a8,(ulong)(byte)puVar21[lVar15 * 2 + -1],4);
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0xf);
        puVar21 = puVar21 + 0x1e;
        bVar25 = lVar10 == 0;
        lVar10 = lVar10 + 1;
      } while (bVar25);
      bVar4 = local_9658[uVar16];
      mpp_put_bits((BitputCtx_t *)local_99a8,(ulong)bVar4,1);
      if (((byte)hal_h265d_debug & 2) != 0) {
        _mpp_log_l(4,"hal_h265d_com","lowdelay_flag = %d \n",(char *)0x0,(ulong)bVar4);
      }
      bVar4 = local_9198[uVar16];
      mpp_put_bits((BitputCtx_t *)local_99a8,(ulong)bVar4,10);
      if (((byte)hal_h265d_debug & 2) != 0) {
        _mpp_log_l(4,"hal_h265d_com","rps_bit_offset = %d \n",(char *)0x0,(ulong)bVar4);
      }
      bVar4 = local_8f38[uVar16];
      mpp_put_bits((BitputCtx_t *)local_99a8,(ulong)bVar4,9);
      if (((byte)hal_h265d_debug & 2) != 0) {
        _mpp_log_l(4,"hal_h265d_com","rps_bit_offset_st = %d \n",(char *)0x0,(ulong)bVar4);
      }
      bVar4 = local_93f8[uVar16];
      mpp_put_bits((BitputCtx_t *)local_99a8,(ulong)bVar4,4);
      if (((byte)hal_h265d_debug & 2) != 0) {
        _mpp_log_l(4,"hal_h265d_com","slice_nb_rps_poc = %d \n",(char *)0x0,(ulong)bVar4);
      }
      mpp_put_align((BitputCtx_t *)local_99a8,0x40,0);
      uVar16 = uVar16 + 1;
      puVar22 = puVar22 + 0x3c;
    } while (uVar16 != uVar14);
  }
  if (local_99b0 != (void *)0x0) {
    memcpy(local_99b0,data,(long)(iVar5 << 5));
  }
  mpp_osal_free("hal_h265d_slice_output_rps",data);
  return 0;
}

Assistant:

RK_S32 hal_h265d_slice_output_rps(void *dxva, void *rps_buf)
{
    RK_U32 i, j, k;
    RK_S32 value;
    RK_U32 nal_type;
    RK_S32 slice_idx = 0;
    BitReadCtx_t gb_cxt, *gb;
    SliceHeader_t sh;
    RK_U8     rps_bit_offset[600];
    RK_U8     rps_bit_offset_st[600];
    RK_U8     slice_nb_rps_poc[600];
    RK_U8     lowdelay_flag[600];
    slice_ref_map_t rps_pic_info[600][2][15];
    RK_U32    nb_refs = 0;
    RK_S32    bit_begin;
    h265d_dxva2_picture_context_t *dxva_cxt = NULL;

    memset(&rps_pic_info,   0, sizeof(rps_pic_info));
    memset(&slice_nb_rps_poc, 0, sizeof(slice_nb_rps_poc));
    memset(&rps_bit_offset, 0, sizeof(rps_bit_offset));
    memset(&rps_bit_offset_st, 0, sizeof(rps_bit_offset_st));
    memset(&lowdelay_flag, 0, sizeof(lowdelay_flag));

    dxva_cxt = (h265d_dxva2_picture_context_t*)dxva;
    for (k = 0; k < dxva_cxt->slice_count; k++) {
        RefPicListTab_t ref;
        memset(&sh, 0, sizeof(SliceHeader_t));
        // mpp_err("data[%d]= 0x%x,size[%d] = %d \n",
        //   k,dxva_cxt->slice_short[k].BSNALunitDataLocation, k,dxva_cxt->slice_short[k].SliceBytesInBuffer);
        mpp_set_bitread_ctx(&gb_cxt, (RK_U8*)(dxva_cxt->bitstream + dxva_cxt->slice_short[k].BSNALunitDataLocation),
                            dxva_cxt->slice_short[k].SliceBytesInBuffer);

        mpp_set_bitread_pseudo_code_type(&gb_cxt, PSEUDO_CODE_H264_H265);
        gb = &gb_cxt;

        READ_ONEBIT(gb, &value);

        if ( value != 0)
            return  MPP_ERR_STREAM;

        READ_BITS(gb, 6, &nal_type);

        if (nal_type > 23) {
            continue;
        }

        SKIP_BITS(gb, 9);

        READ_ONEBIT(gb, &sh.first_slice_in_pic_flag);

        if (nal_type >= 16 && nal_type <= 23)
            READ_ONEBIT(gb, &sh.no_output_of_prior_pics_flag);

        READ_UE(gb, &sh.pps_id);

        if (sh.pps_id >= 64 ) {
            mpp_err( "PPS id out of range: %d\n", sh.pps_id);
            return  MPP_ERR_STREAM;
        }

        sh.dependent_slice_segment_flag = 0;
        if (!sh.first_slice_in_pic_flag) {
            RK_S32 slice_address_length;
            RK_S32 width, height, ctb_width, ctb_height;
            RK_S32 log2_min_cb_size = dxva_cxt->pp.log2_min_luma_coding_block_size_minus3 + 3;
            RK_S32 log2_ctb_size = log2_min_cb_size + dxva_cxt->pp.log2_diff_max_min_luma_coding_block_size;

            width = (dxva_cxt->pp.PicWidthInMinCbsY << log2_min_cb_size);
            height = (dxva_cxt->pp.PicHeightInMinCbsY << log2_min_cb_size);

            ctb_width  = (width  + (1 << log2_ctb_size) - 1) >> log2_ctb_size;
            ctb_height = (height + (1 << log2_ctb_size) - 1) >> log2_ctb_size;

            if (dxva_cxt->pp.dependent_slice_segments_enabled_flag)
                READ_ONEBIT(gb, &sh.dependent_slice_segment_flag);

            slice_address_length = mpp_ceil_log2(ctb_width * ctb_height);

            READ_BITS(gb, slice_address_length, &sh.slice_segment_addr);

            if (sh.slice_segment_addr >= (RK_U32)(ctb_width * ctb_height)) {
                mpp_err(
                    "Invalid slice segment address: %u.\n",
                    sh.slice_segment_addr);
                return  MPP_ERR_STREAM;
            }

            if (!sh.dependent_slice_segment_flag) {
                sh.slice_addr = sh.slice_segment_addr;
                slice_idx++;
            }
        } else {
            sh.slice_segment_addr = sh.slice_addr = 0;
            slice_idx           = 0;
        }

        if (!sh.dependent_slice_segment_flag) {
            for (i = 0; i < dxva_cxt->pp.num_extra_slice_header_bits; i++)
                SKIP_BITS(gb, 1);

            READ_UE(gb, &sh.slice_type);
            if (!(sh.slice_type == I_SLICE ||
                  sh.slice_type == P_SLICE ||
                  sh.slice_type == B_SLICE)) {
                mpp_err( "Unknown slice type: %d.\n",
                         sh.slice_type);
                return  MPP_ERR_STREAM;
            }
            /*     if (!s->decoder_id && IS_IRAP(nal_type) && sh->slice_type != I_SLICE) {
                     mpp_err( "Inter slices in an IRAP frame.\n");
                     return  MPP_ERR_STREAM;
                 }*/

            if (dxva_cxt->pp.output_flag_present_flag)
                READ_ONEBIT(gb, &sh.pic_output_flag);

            if (dxva_cxt->pp.separate_colour_plane_flag)
                READ_BITS(gb, 2, &sh.colour_plane_id );

            if (!IS_IDR(nal_type)) {
                int short_term_ref_pic_set_sps_flag;

                READ_BITS(gb, (dxva_cxt->pp.log2_max_pic_order_cnt_lsb_minus4 + 4), &sh.pic_order_cnt_lsb);

                READ_ONEBIT(gb, &short_term_ref_pic_set_sps_flag);

                bit_begin = gb->used_bits;

                if (!short_term_ref_pic_set_sps_flag) {
                    SKIP_BITS(gb, dxva_cxt->pp.wNumBitsForShortTermRPSInSlice);
                } else {
                    RK_S32 numbits, rps_idx;
                    if (!dxva_cxt->pp.num_short_term_ref_pic_sets) {
                        mpp_err( "No ref lists in the SPS.\n");
                        return  MPP_ERR_STREAM;
                    }
                    numbits = mpp_ceil_log2(dxva_cxt->pp.num_short_term_ref_pic_sets);
                    rps_idx = 0;
                    if (numbits > 0)
                        READ_BITS(gb, numbits, &rps_idx);
                }

                rps_bit_offset_st[slice_idx] = gb->used_bits - bit_begin;
                rps_bit_offset[slice_idx] = rps_bit_offset_st[slice_idx];
                if (dxva_cxt->pp.long_term_ref_pics_present_flag) {

//                    RK_S32 max_poc_lsb    = 1 << (dxva_cxt->pp.log2_max_pic_order_cnt_lsb_minus4 + 4);
                    RK_U32 nb_sps = 0, nb_sh;

                    bit_begin = gb->used_bits;
                    if (dxva_cxt->pp.num_long_term_ref_pics_sps > 0)
                        READ_UE(gb, &nb_sps);

                    READ_UE(gb, &nb_sh);

                    nb_refs = nb_sh + nb_sps;

                    for (i = 0; i < nb_refs; i++) {
                        RK_U8 delta_poc_msb_present;

                        if ((RK_U32)i < nb_sps) {
                            RK_U8 lt_idx_sps = 0;

                            if (dxva_cxt->pp.num_long_term_ref_pics_sps > 1)
                                READ_BITS(gb, mpp_ceil_log2(dxva_cxt->pp.num_long_term_ref_pics_sps), &lt_idx_sps);
                        } else {
                            SKIP_BITS(gb, (dxva_cxt->pp.log2_max_pic_order_cnt_lsb_minus4 + 4));
                            SKIP_BITS(gb, 1);
                        }

                        READ_ONEBIT(gb, &delta_poc_msb_present);
                        if (delta_poc_msb_present) {
                            RK_S32 delta = 0;
                            READ_UE(gb, &delta);
                        }
                    }
                    rps_bit_offset[slice_idx] += (gb->used_bits - bit_begin);

                }

                if (dxva_cxt->pp.sps_temporal_mvp_enabled_flag)
                    READ_ONEBIT(gb, &sh.slice_temporal_mvp_enabled_flag);
                else
                    sh.slice_temporal_mvp_enabled_flag = 0;
            } else {
                sh.short_term_rps = NULL;
            }

            if (dxva_cxt->pp.sample_adaptive_offset_enabled_flag) {
                READ_ONEBIT(gb, &sh.slice_sample_adaptive_offset_flag[0]);
                READ_ONEBIT(gb, &sh.slice_sample_adaptive_offset_flag[1]);
                sh.slice_sample_adaptive_offset_flag[2] =
                    sh.slice_sample_adaptive_offset_flag[1];
            } else {
                sh.slice_sample_adaptive_offset_flag[0] = 0;
                sh.slice_sample_adaptive_offset_flag[1] = 0;
                sh.slice_sample_adaptive_offset_flag[2] = 0;
            }

            sh.nb_refs[L0] = sh.nb_refs[L1] = 0;
            if (sh.slice_type == P_SLICE || sh.slice_type == B_SLICE) {

                sh.nb_refs[L0] = dxva_cxt->pp.num_ref_idx_l0_default_active_minus1 + 1;
                if (sh.slice_type == B_SLICE)
                    sh.nb_refs[L1] =  dxva_cxt->pp.num_ref_idx_l1_default_active_minus1 + 1;

                READ_ONEBIT(gb, &value);

                if (value) { // num_ref_idx_active_override_flag
                    READ_UE(gb, &sh.nb_refs[L0]);
                    sh.nb_refs[L0] += 1;
                    if (sh.slice_type == B_SLICE) {
                        READ_UE(gb, &sh.nb_refs[L1]);
                        sh.nb_refs[L1] += 1;
                    }
                }
                if (sh.nb_refs[L0] > MAX_REFS || sh.nb_refs[L1] > MAX_REFS) {
                    mpp_err( "Too many refs: %d/%d.\n",
                             sh.nb_refs[L0], sh.nb_refs[L1]);
                    return  MPP_ERR_STREAM;
                }

                sh.rpl_modification_flag[0] = 0;
                sh.rpl_modification_flag[1] = 0;
                nb_refs = 0;
                for (i = 0; i < (RK_S32)MPP_ARRAY_ELEMS(dxva_cxt->pp.RefPicList); i++) {
                    if (dxva_cxt->pp.RefPicList[i].bPicEntry != 0xff) {
                        h265h_dbg(H265H_DBG_RPS, "dxva_cxt->pp.RefPicList[i].bPicEntry = %d", dxva_cxt->pp.RefPicList[i].bPicEntry);
                        nb_refs++;
                    }
                }

                if (!nb_refs) {
                    mpp_err( "Zero refs for a frame with P or B slices.\n");
                    return  MPP_ERR_STREAM;
                }

                if (dxva_cxt->pp.lists_modification_present_flag && nb_refs > 1) {
                    READ_ONEBIT(gb, &sh.rpl_modification_flag[0]);
                    if (sh.rpl_modification_flag[0]) {
                        for (i = 0; (RK_U32)i < sh.nb_refs[L0]; i++)
                            READ_BITS(gb, mpp_ceil_log2(nb_refs), &sh.list_entry_lx[0][i]);
                    }

                    if (sh.slice_type == B_SLICE) {
                        READ_ONEBIT(gb, &sh.rpl_modification_flag[1]);
                        if (sh.rpl_modification_flag[1] == 1)
                            for (i = 0; (RK_U32)i < sh.nb_refs[L1]; i++)
                                READ_BITS(gb, mpp_ceil_log2(nb_refs), &sh.list_entry_lx[1][i]);
                    }
                }
            }
        }

        if (!sh.dependent_slice_segment_flag &&
            sh.slice_type != I_SLICE) {
            RK_U32 nb_list = I_SLICE - sh.slice_type;

            hal_h265d_slice_rpl(dxva, &sh, &ref);
            lowdelay_flag[slice_idx]  =  1;

            for (j = 0; j < nb_list; j++) {
                for (i = 0; i < ref.refPicList[j].nb_refs; i++) {
                    RK_U8 index = 0;
                    index = ref.refPicList[j].dpb_index[i];
                    // mpp_err("slice_idx = %d index = %d,j = %d i = %d",slice_idx,index,j,i);
                    if (index != 0xff) {
                        rps_pic_info[slice_idx][j][i].dpb_index = index;
                        rps_pic_info[slice_idx][j][i].is_long_term
                            = dxva_cxt->pp.RefPicList[index].AssociatedFlag;
                        if (dxva_cxt->pp.PicOrderCntValList[index] > dxva_cxt->pp.CurrPicOrderCntVal)
                            lowdelay_flag[slice_idx] = 0;
                    }
                }
            }

            if (sh.slice_type == I_SLICE)
                slice_nb_rps_poc[slice_idx] = 0;
            else
                slice_nb_rps_poc[slice_idx] = nb_refs;

        }
    }
//out put for rk format
    {
        RK_S32  nb_slice = slice_idx + 1;
        RK_S32  fifo_len   = nb_slice * 4 + 1;//size of rps_packet alloc more 1 64 bit invoid buffer no enought
        RK_U64 *rps_packet = mpp_malloc(RK_U64, fifo_len);
        BitputCtx_t bp;
        mpp_set_bitput_ctx(&bp, rps_packet, fifo_len);
        for (k = 0; k < (RK_U32)nb_slice; k++) {
            for (j = 0; j < 2; j++) {
                for (i = 0; i < 15; i++) {
                    mpp_put_bits(&bp, rps_pic_info[k][j][i].is_long_term, 1);
                    if (j == 1 && i == 4) {
                        mpp_put_align (&bp, 64, 0);
                    }
                    mpp_put_bits(&bp, rps_pic_info[k][j][i].dpb_index,    4);
                }
            }
            mpp_put_bits(&bp, lowdelay_flag      [k], 1);
            h265h_dbg(H265H_DBG_RPS, "lowdelay_flag = %d \n", lowdelay_flag[k]);
            mpp_put_bits(&bp, rps_bit_offset     [k], 10);

            h265h_dbg(H265H_DBG_RPS, "rps_bit_offset = %d \n", rps_bit_offset[k]);
            mpp_put_bits(&bp, rps_bit_offset_st  [k], 9);

            h265h_dbg(H265H_DBG_RPS, "rps_bit_offset_st = %d \n", rps_bit_offset_st[k]);
            mpp_put_bits(&bp, slice_nb_rps_poc   [k], 4);

            h265h_dbg(H265H_DBG_RPS, "slice_nb_rps_poc = %d \n", slice_nb_rps_poc[k]);
            mpp_put_align   (&bp, 64, 0);
        }
        if (rps_buf != NULL) {
            memcpy(rps_buf, rps_packet, nb_slice * 32);
        }
        mpp_free(rps_packet);
    }

    return 0;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}